

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

void wasm::PrintExpressionContents::handleResumeTable<wasm::Resume>(ostream *o,Resume *curr)

{
  Name *pNVar1;
  undefined8 in_RAX;
  uint uVar2;
  ulong uVar3;
  undefined8 uStack_38;
  
  if ((curr->handlerTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements !=
      0) {
    uVar2 = 1;
    uVar3 = 0;
    uStack_38 = in_RAX;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(o," (",2);
      Colors::outputColorCode(o,"\x1b[35m");
      Colors::outputColorCode(o,"\x1b[1m");
      std::__ostream_insert<char,std::char_traits<char>>(o,"on ",3);
      Colors::outputColorCode(o,"\x1b[0m");
      if ((curr->handlerTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
          usedElements <= uVar3) {
LAB_00a34e91:
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                      ,0xbc,
                      "T &ArenaVectorBase<ArenaVector<wasm::Name>, wasm::Name>::operator[](size_t) const [SubType = ArenaVector<wasm::Name>, T = wasm::Name]"
                     );
      }
      Name::print((curr->handlerTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
                  data + uVar3,o);
      uStack_38 = CONCAT17(0x20,(undefined7)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>(o,(char *)((long)&uStack_38 + 7),1);
      if ((curr->handlerBlocks).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
          usedElements <= uVar3) goto LAB_00a34e91;
      pNVar1 = (curr->handlerBlocks).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data
      ;
      if (pNVar1[uVar3].super_IString.str._M_str == (char *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>(o,"switch",6);
      }
      else {
        Name::print(pNVar1 + uVar3,o);
      }
      uStack_38._0_7_ = CONCAT16(0x29,(undefined6)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>(o,(char *)((long)&uStack_38 + 6),1);
      uVar3 = (ulong)uVar2;
      uVar2 = uVar2 + 1;
    } while (uVar3 < (curr->handlerTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
                     usedElements);
  }
  return;
}

Assistant:

static void handleResumeTable(std::ostream& o, ResumeType* curr) {
    static_assert(std::is_base_of<ResumeType, Resume>::value ||
                  std::is_base_of<ResumeType, ResumeThrow>::value);
    for (Index i = 0; i < curr->handlerTags.size(); i++) {
      o << " (";
      printMedium(o, "on ");
      curr->handlerTags[i].print(o);
      o << ' ';
      if (curr->handlerBlocks[i].isNull()) {
        o << "switch";
      } else {
        curr->handlerBlocks[i].print(o);
      }
      o << ')';
    }
  }